

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

void soul::HEARTGenerator::build
               (ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> sourceModules,
               ArrayView<soul::pool_ref<soul::Module>_> targetModules,
               uint32_t maxNestedExpressionDepth)

{
  long lVar1;
  pool_ref<soul::AST::ModuleBase> *ppVar2;
  pool_ref<soul::AST::ModuleBase> *ppVar3;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ref<soul::AST::ModuleBase> *ppVar4;
  long lVar5;
  long lVar6;
  vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> generators;
  vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_> local_d8;
  long local_b8;
  HEARTGenerator local_b0;
  
  ppVar2 = sourceModules.e;
  ppVar3 = sourceModules.s;
  ppVar4 = ppVar3;
  if (ppVar3 == ppVar2) {
    local_d8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    do {
      SanityCheckPass::runPreHEARTGenChecks(ppVar4->object);
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar2);
    local_d8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((long)ppVar2 - (long)ppVar3 != 0) {
      local_b8 = (long)ppVar2 - (long)ppVar3 >> 3;
      lVar1 = local_b8 + (ulong)(local_b8 == 0);
      lVar5 = 0;
      do {
        if ((long)targetModules.e - (long)targetModules.s >> 3 == lVar5) {
          throwInternalCompilerError("i < size()","operator[]",0xc4);
        }
        HEARTGenerator(&local_b0,ppVar3[lVar5].object,targetModules.s[lVar5].object,
                       maxNestedExpressionDepth);
        std::vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>::
        emplace_back<soul::HEARTGenerator>(&local_d8,&local_b0);
        local_b0.super_ASTVisitor._vptr_ASTVisitor = (_func_int **)&PTR__HEARTGenerator_002cfc68;
        FunctionBuilder::~FunctionBuilder(&local_b0.builder);
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
      if (ppVar3 != ppVar2) {
        lVar1 = local_b8 + (ulong)(local_b8 == 0);
        lVar5 = 0;
        lVar6 = 0;
        do {
          (**(code **)(*(long *)((long)&((local_d8.
                                          super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_ASTVisitor)._vptr_ASTVisitor + lVar5) + 0x10))
                    ((long)&((local_d8.
                              super__Vector_base<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>
                              ._M_impl.super__Vector_impl_data._M_start)->super_ASTVisitor).
                            _vptr_ASTVisitor + lVar5,ppVar3[lVar6].object);
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x80;
        } while (lVar1 != lVar6);
      }
    }
  }
  std::vector<soul::HEARTGenerator,_std::allocator<soul::HEARTGenerator>_>::~vector(&local_d8);
  return;
}

Assistant:

static void build (ArrayView<pool_ref<AST::ModuleBase>> sourceModules,
                       ArrayView<pool_ref<Module>> targetModules,
                       uint32_t maxNestedExpressionDepth = 255)
    {
        for (auto& m : sourceModules)
            SanityCheckPass::runPreHEARTGenChecks (m);

        std::vector<HEARTGenerator> generators;

        for (size_t i = 0; i < sourceModules.size(); ++i)
            generators.push_back ({ sourceModules[i], targetModules[i], maxNestedExpressionDepth });

        for (size_t i = 0; i < sourceModules.size(); ++i)
            generators[i].visitObject (sourceModules[i]);
    }